

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint __thiscall
ON_SubDVertex::ReplaceFaceInArray(ON_SubDVertex *this,ON_SubDFace *old_face,ON_SubDFace *new_face)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = 0xffffffff;
  if (old_face != new_face && old_face != (ON_SubDFace *)0x0) {
    uVar2 = FaceArrayIndex(this,old_face);
    if (uVar2 != 0xffffffff) {
      if (new_face == (ON_SubDFace *)0x0) {
        uVar1 = this->m_face_count;
        this->m_face_count = uVar1 - 1;
        uVar4 = uVar2 + 1;
        if (uVar4 < uVar1) {
          uVar5 = (ulong)uVar2;
          iVar3 = ~uVar2 + (uint)uVar1;
          do {
            this->m_faces[uVar5 & 0xffffffff] = this->m_faces[uVar5 + 1];
            uVar5 = uVar5 + 1;
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
          uVar4 = (uint)uVar1;
        }
      }
      else {
        this->m_faces[uVar2] = new_face;
        uVar4 = uVar2;
      }
    }
  }
  return uVar4;
}

Assistant:

unsigned int ON_SubDVertex::ReplaceFaceInArray(const ON_SubDFace * old_face, const ON_SubDFace * new_face)
{
  unsigned vfi = (nullptr != old_face && old_face != new_face) ? FaceArrayIndex(old_face) : ON_UNSET_UINT_INDEX;
  if (ON_UNSET_UINT_INDEX == vfi)
    return ON_UNSET_UINT_INDEX;
  if (nullptr != new_face)
  {
    m_faces[vfi] = new_face;
  }
  else
  {
    const unsigned c = (unsigned)(m_face_count--);
    while (++vfi < c)
      m_faces[vfi - 1] = m_faces[vfi];
  }
  return vfi;
}